

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_matrix.cc
# Opt level: O2

void __thiscall
ipx::NormalMatrix::_Apply(NormalMatrix *this,Vector *rhs,Vector *lhs,double *rhs_dot_lhs)

{
  ulong uVar1;
  int *piVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Model *pMVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  ulong uVar15;
  Int p;
  long lVar16;
  ulong uVar17;
  double dVar18;
  Timer timer;
  Timer local_40;
  double local_38;
  
  pMVar7 = this->model_;
  uVar4 = pMVar7->num_rows_;
  uVar5 = pMVar7->num_cols_;
  piVar8 = (pMVar7->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar9 = (pMVar7->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar10 = (pMVar7->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  Timer::Timer(&local_40);
  pdVar11 = this->W_;
  if (pdVar11 == (double *)0x0) {
    local_38 = 0.0;
    std::valarray<double>::operator=(lhs,&local_38);
    uVar15 = 0;
    uVar17 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar17 = uVar15;
    }
    while (uVar15 != uVar17) {
      piVar2 = piVar8 + uVar15;
      iVar6 = piVar8[uVar15 + 1];
      uVar15 = uVar15 + 1;
      dVar18 = 0.0;
      lVar14 = (long)*piVar2;
      for (lVar16 = lVar14; lVar16 < iVar6; lVar16 = lVar16 + 1) {
        dVar18 = dVar18 + rhs->_M_data[piVar9[lVar16]] * pdVar10[lVar16];
      }
      pdVar11 = lhs->_M_data;
      for (; lVar14 < iVar6; lVar14 = lVar14 + 1) {
        pdVar11[piVar9[lVar14]] = pdVar10[lVar14] * dVar18 + pdVar11[piVar9[lVar14]];
      }
    }
  }
  else {
    pdVar12 = rhs->_M_data;
    pdVar13 = lhs->_M_data;
    uVar15 = 0;
    uVar17 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar17 = uVar15;
    }
    for (; uVar17 != uVar15; uVar15 = uVar15 + 1) {
      pdVar13[uVar15] = pdVar12[uVar15] * pdVar11[(long)(int)uVar5 + uVar15];
    }
    uVar17 = 0;
    uVar15 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar15 = uVar17;
    }
    while (uVar17 != uVar15) {
      uVar1 = uVar17 + 1;
      iVar6 = piVar8[uVar17 + 1];
      dVar18 = 0.0;
      lVar14 = (long)piVar8[uVar17];
      for (lVar16 = lVar14; lVar16 < iVar6; lVar16 = lVar16 + 1) {
        dVar18 = dVar18 + rhs->_M_data[piVar9[lVar16]] * pdVar10[lVar16];
      }
      dVar3 = pdVar11[uVar17];
      pdVar12 = lhs->_M_data;
      for (; uVar17 = uVar1, lVar14 < iVar6; lVar14 = lVar14 + 1) {
        pdVar12[piVar9[lVar14]] = pdVar10[lVar14] * dVar18 * dVar3 + pdVar12[piVar9[lVar14]];
      }
    }
  }
  if (rhs_dot_lhs != (double *)0x0) {
    dVar18 = Dot(rhs,lhs);
    *rhs_dot_lhs = dVar18;
  }
  dVar18 = Timer::Elapsed(&local_40);
  this->time_ = dVar18 + this->time_;
  return;
}

Assistant:

void NormalMatrix::_Apply(const Vector& rhs, Vector& lhs,
                           double* rhs_dot_lhs) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Int* Ap = model_.AI().colptr();
    const Int* Ai = model_.AI().rowidx();
    const double* Ax = model_.AI().values();
    #if MATVECMETHOD == 2
    const Int* Atp = model_.AIt().colptr();
    const Int* Ati = model_.AIt().rowidx();
    const double* Atx = model_.AIt().values();
    #endif
    Timer timer;

    assert(prepared_);
    assert((Int)lhs.size() == m);
    assert((Int)rhs.size() == m);

    if (W_) {
        #if MATVECMETHOD == 1
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            d *= W_[j];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
        #elif MATVECMETHOD == 2
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            work_[j] = d * W_[j];
        }
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int i = 0; i < m; i++) {
            Int begin = Atp[i], end = Atp[i+1]-1; // skip identity entry
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += work_[Ati[p]] * Atx[p];
            lhs[i] += d;
        }
        #elif MATVECMETHOD == 3
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            work_[j] = d * W_[j];
        }
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = work_[j];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
        #else
        #error "invalid MATHVECMETHOD"
        #endif
    } else {
        lhs = 0.0;
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
    }
    if (rhs_dot_lhs)
        *rhs_dot_lhs = Dot(rhs,lhs);
    time_ += timer.Elapsed();
}